

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deserializer.hpp
# Opt level: O2

void mserialize::detail::BuiltinDeserializer<std::deque<int,_std::allocator<int>_>,_void>::
     deserialize_elems_noinsert<InputStream>(long param_1,undefined8 param_2,InputStream *param_3)

{
  int *piVar1;
  int *piVar2;
  int *elem;
  int *t;
  long lVar3;
  
  t = *(int **)(param_1 + 0x10);
  piVar2 = *(int **)(param_1 + 0x20);
  lVar3 = *(long *)(param_1 + 0x28);
  piVar1 = *(int **)(param_1 + 0x30);
  while (t != piVar1) {
    TrivialDeserializer<int>::deserialize<InputStream>(t,param_3);
    t = t + 1;
    if (t == piVar2) {
      t = *(int **)(lVar3 + 8);
      lVar3 = lVar3 + 8;
      piVar2 = t + 0x80;
    }
  }
  return;
}

Assistant:

static void deserialize_elems_noinsert(
    std::false_type /* no batch deserialization */,
    std::false_type /* not a proxy sequence */,
    Sequence& s, std::uint32_t /*size*/, InputStream& istream
  )
  {
    for (auto&& elem : s)
    {
      mserialize::deserialize(elem, istream);
    }
  }